

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t size;
  
  size = 0;
  info->iccp_defined = 1;
  if (info->iccp_name != (char *)0x0) {
    lodepng_clear_icc(info);
  }
  uVar3 = 2;
  while ((uVar4 = (ulong)(uVar3 - 2), uVar4 < chunkLength && (data[uVar4] != '\0'))) {
    uVar3 = uVar3 + 1;
  }
  if (uVar3 < chunkLength) {
    if (uVar3 - 0x52 < 0xffffffb1) {
      uVar3 = 0x59;
    }
    else {
      pcVar1 = (char *)malloc((ulong)(uVar3 - 1));
      info->iccp_name = pcVar1;
      if (pcVar1 == (char *)0x0) {
        uVar3 = 0x53;
      }
      else {
        pcVar1[uVar4] = '\0';
        for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
          info->iccp_name[uVar2] = data[uVar2];
        }
        if (data[uVar3 - 1] == '\0') {
          uVar3 = zlib_decompress(&info->iccp_profile,&size,0,data + uVar3,
                                  (ulong)((int)chunkLength - uVar3),zlibsettings);
          info->iccp_profile_size = (uint)size;
          if ((uVar3 == 0) && (uVar3 = 0, (uint)size == 0)) {
            uVar3 = 100;
          }
        }
        else {
          uVar3 = 0x48;
        }
      }
    }
  }
  else {
    uVar3 = 0x4b;
  }
  return uVar3;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;

  unsigned length, string2_begin;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, zlibsettings);
  info->iccp_profile_size = size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}